

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType0::Decode(GridDataType0 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  ushort local_50;
  uchar local_4e [6];
  KUINT16 i;
  KUINT8 tmp;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GridDataType0 *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 6) {
    local_4e[1] = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    local_4e[1] = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_vui8DataVals);
  GridData::Decode(&this->super_GridData,local_18);
  KDataStream::operator>>(local_18,(unsigned_short *)&(this->super_GridData).field_0xc);
  local_4e[0] = '\0';
  for (local_50 = 0; local_50 < *(ushort *)&(this->super_GridData).field_0xc;
      local_50 = local_50 + 1) {
    KDataStream::operator>>(local_18,local_4e);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vui8DataVals,local_4e);
  }
  if ((uint)*(ushort *)&(this->super_GridData).field_0xc % 2 == 1) {
    KDataStream::operator>>(local_18,&this->m_ui8Padding);
  }
  return;
}

Assistant:

void GridDataType0::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_DATA_TYPE0_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui8DataVals.clear();

    GridData::Decode( stream );

    stream >> m_ui16NumBytes;

    KUINT8 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        stream >> tmp;
        m_vui8DataVals.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumBytes % 2 == 1 )
    {
        stream >> m_ui8Padding;
    }
}